

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.h
# Opt level: O0

char * absl::LogSeverityName(LogSeverity s)

{
  char *local_28;
  char *local_20;
  char *local_18;
  LogSeverity s_local;
  
  if (s == kInfo) {
    local_18 = "INFO";
  }
  else {
    if (s == kWarning) {
      local_20 = "WARNING";
    }
    else {
      if (s == kError) {
        local_28 = "ERROR";
      }
      else {
        local_28 = "UNKNOWN";
        if (s == kFatal) {
          local_28 = "FATAL";
        }
      }
      local_20 = local_28;
    }
    local_18 = local_20;
  }
  return local_18;
}

Assistant:

constexpr const char* LogSeverityName(absl::LogSeverity s) {
  return s == absl::LogSeverity::kInfo
             ? "INFO"
             : s == absl::LogSeverity::kWarning
                   ? "WARNING"
                   : s == absl::LogSeverity::kError
                         ? "ERROR"
                         : s == absl::LogSeverity::kFatal ? "FATAL" : "UNKNOWN";
}